

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceFormatsTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance instance;
  VkPhysicalDevice pVVar1;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  unsigned_long uVar2;
  bool bVar3;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  VkInstance_s **ppVVar4;
  Display *nativeDisplay;
  Window *nativeWindow;
  size_type sVar5;
  const_reference ppVVar6;
  Handle<(vk::HandleType)25> *pHVar7;
  MessageBuilder *pMVar8;
  Array<__gnu_cxx::__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>_>
  AVar9;
  string local_520;
  VkSurfaceKHR local_500;
  CheckIncompleteResult<vk::VkSurfaceFormatKHR> local_4f8;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  local_4e0;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  local_4d8;
  Array<__gnu_cxx::__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>_>
  local_4d0;
  MessageBuilder local_4c0;
  deUint64 local_340;
  undefined1 local_338 [8];
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  unsigned_long local_318;
  size_t deviceNdx;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  RefData<vk::Handle<(vk::HandleType)25>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  undefined1 local_288 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector results;
  TestLog *log;
  Type wsiType_local;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,log_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_288,context,
             (Extensions *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  instance = *ppVVar4;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_288);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)
             &physicalDevices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,wsiType,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2d8,
             (Move *)&physicalDevices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data.deleter.m_instanceIface = local_2d8.deleter.m_instanceIface;
  data.object.m_internal = local_2d8.object.m_internal;
  data.deleter.m_instance = local_2d8.deleter.m_instance;
  data.deleter.m_allocator = local_2d8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2b8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)
             &physicalDevices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             *ppVVar4);
  local_318 = 0;
  while( true ) {
    uVar2 = local_318;
    sVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)&deviceNdx);
    if (sVar5 <= uVar2) break;
    ppVVar6 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,local_318);
    pVVar1 = *ppVVar6;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
    formats.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar7->m_internal;
    bVar3 = isSupportedByAnyQueue
                      ((InstanceInterface *)
                       &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
                        m_allocator,pVVar1,
                       (VkSurfaceKHR)
                       formats.
                       super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) {
      ppVVar6 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
                operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                            *)&deviceNdx,local_318);
      pVVar1 = *ppVVar6;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
      local_340 = pHVar7->m_internal;
      ::vk::wsi::getPhysicalDeviceSurfaceFormats
                ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                 local_338,
                 (InstanceInterface *)
                 &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
                 pVVar1,(VkSurfaceKHR)local_340);
      tcu::TestLog::operator<<
                (&local_4c0,(TestLog *)results.m_message.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [8])"Device ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_318);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x134fa06);
      local_4d8._M_current =
           (VkSurfaceFormatKHR *)
           std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::begin
                     ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                      local_338);
      local_4e0._M_current =
           (VkSurfaceFormatKHR *)
           std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::end
                     ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                      local_338);
      AVar9 = tcu::
              formatArray<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR_const*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>>
                        (&local_4d8,&local_4e0);
      local_4d0 = AVar9;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4d0);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      validateSurfaceFormats
                ((ResultCollector *)local_78,wsiType,
                 (vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                 local_338);
      local_4f8._vptr_CheckIncompleteResult = (_func_int **)0x0;
      local_4f8.m_count = 0;
      local_4f8.m_result = VK_SUCCESS;
      CheckPhysicalDeviceSurfaceFormatsIncompleteResult::
      CheckPhysicalDeviceSurfaceFormatsIncompleteResult
                ((CheckPhysicalDeviceSurfaceFormatsIncompleteResult *)&local_4f8);
      ppVVar6 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
                operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                            *)&deviceNdx,local_318);
      pVVar1 = *ppVVar6;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
      local_500.m_internal = pHVar7->m_internal;
      sVar5 = std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::size
                        ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                         local_338);
      CheckIncompleteResult<vk::VkSurfaceFormatKHR>::operator()
                (&local_4f8,(ResultCollector *)local_78,
                 (InstanceInterface *)
                 &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
                 pVVar1,local_500,sVar5);
      CheckPhysicalDeviceSurfaceFormatsIncompleteResult::
      ~CheckPhysicalDeviceSurfaceFormatsIncompleteResult
                ((CheckPhysicalDeviceSurfaceFormatsIncompleteResult *)&local_4f8);
      std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::~vector
                ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                 local_338);
    }
    local_318 = local_318 + 1;
  }
  code = tcu::ResultCollector::getResult((ResultCollector *)local_78);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_520,(ResultCollector *)local_78);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
  NativeObjects::~NativeObjects((NativeObjects *)local_288);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus querySurfaceFormatsTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);
	const NativeObjects				native			(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
		{
			const vector<VkSurfaceFormatKHR>	formats	= getPhysicalDeviceSurfaceFormats(instHelper.vki,
																						  physicalDevices[deviceNdx],
																						  *surface);

			log << TestLog::Message << "Device " << deviceNdx << ": " << tcu::formatArray(formats.begin(), formats.end()) << TestLog::EndMessage;

			validateSurfaceFormats(results, wsiType, formats);
			CheckPhysicalDeviceSurfaceFormatsIncompleteResult()(results, instHelper.vki, physicalDevices[deviceNdx], *surface, formats.size());
		}
		// else skip query as surface is not supported by the device
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}